

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O2

void lts2::HardThresholding(Mat *src,Mat *thresholdedCoeffs,float threshold)

{
  float fVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  
  cv::Mat::copyTo((_OutputArray *)src);
  uVar5 = *(uint *)(thresholdedCoeffs + 8);
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar5) {
    uVar8 = uVar5;
  }
  bVar11 = ((byte)thresholdedCoeffs[1] & 0x40) == 0;
  if (bVar11) {
    uVar5 = 1;
  }
  lVar2 = *(long *)(thresholdedCoeffs + 0x10);
  uVar9 = (ulong)uVar8;
  if (!bVar11) {
    uVar9 = 1;
  }
  plVar3 = *(long **)(thresholdedCoeffs + 0x48);
  iVar6 = uVar5 * *(int *)(thresholdedCoeffs + 0xc);
  if ((int)(uVar5 * *(int *)(thresholdedCoeffs + 0xc)) < 1) {
    iVar6 = 0;
  }
  for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
    lVar4 = *plVar3;
    iVar10 = iVar6;
    while (bVar11 = iVar10 != 0, iVar10 = iVar10 + -1, bVar11) {
      fVar1 = *(float *)(lVar2 + lVar4 * uVar7);
      *(float *)(lVar2 + lVar4 * uVar7) =
           (float)(-(uint)(threshold < ABS(fVar1)) & 0x3f800000) * fVar1;
    }
  }
  return;
}

Assistant:

void lts2::HardThresholding(const cv::Mat &src, cv::Mat &thresholdedCoeffs, float threshold)
{
  src.copyTo(thresholdedCoeffs);
    
  int rows = thresholdedCoeffs.rows;
  int cols = thresholdedCoeffs.cols;
    
  if (thresholdedCoeffs.isContinuous())
  {
    cols *= rows;
    rows = 1;
  }
    
  for (int y = 0; y < rows; ++y)
  {
    float *p_coeffs = thresholdedCoeffs.ptr<float>(y);
    for (int x = 0; x < cols; ++x) 
      *p_coeffs *= (std::fabs(*p_coeffs) - threshold > 0.0f ? 1.0f: 0.0f);
  }
}